

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O3

bool __thiscall
wasm::InsertOrderedSet<wasm::HeapType>::insert(InsertOrderedSet<wasm::HeapType> *this,HeapType *val)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>,_false,_true>,_bool>
  pVar3;
  
  pVar3 = std::
          _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,std::_List_iterator<wasm::HeapType>>,std::allocator<std::pair<wasm::HeapType_const,std::_List_iterator<wasm::HeapType>>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<wasm::HeapType_const,std::_List_iterator<wasm::HeapType>>>();
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    p_Var2 = (_List_node_base *)operator_new(0x18);
    p_Var2[1]._M_next = (_List_node_base *)val->id;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    psVar1 = &(this->List).super__List_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
              ._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    *(_List_node_base **)
     ((long)pVar3.first.
            super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>,_true>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>,_true>
     + 0x10) = (this->List).super__List_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl._M_node.super__List_node_base._M_prev;
  }
  return (bool)(pVar3.second & 1);
}

Assistant:

bool insert(const T& val) {
    auto [it, inserted] = Map.insert({val, List.begin()});
    if (inserted) {
      List.push_back(val);
      it->second = --List.end();
    }
    return inserted;
  }